

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeEmitter::_emitOpArray
          (CodeEmitter *this,uint32_t instId,Operand_ *opArray,size_t opCount)

{
  Error EVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  Operand_ *pOVar2;
  Operand_ *pOVar3;
  Operand_ *pOVar4;
  
  switch(opCount) {
  case 0:
    opArray = &this->_none;
    UNRECOVERED_JUMPTABLE = this->_vptr_CodeEmitter[4];
    break;
  case 1:
    UNRECOVERED_JUMPTABLE = this->_vptr_CodeEmitter[4];
    break;
  case 2:
    pOVar2 = opArray + 1;
    UNRECOVERED_JUMPTABLE = this->_vptr_CodeEmitter[4];
    pOVar3 = &this->_none;
    pOVar4 = &this->_none;
    goto LAB_0010dd24;
  case 3:
    pOVar4 = &this->_none;
    goto LAB_0010dd05;
  case 4:
    pOVar4 = opArray + 3;
LAB_0010dd05:
    pOVar2 = opArray + 1;
    UNRECOVERED_JUMPTABLE = this->_vptr_CodeEmitter[4];
    pOVar3 = opArray + 2;
    goto LAB_0010dd24;
  case 5:
    goto LAB_0010dd52;
  case 6:
LAB_0010dd52:
    EVar1 = (*this->_vptr_CodeEmitter[5])();
    return EVar1;
  default:
    return 3;
  }
  pOVar2 = &this->_none;
  pOVar3 = pOVar2;
  pOVar4 = pOVar2;
LAB_0010dd24:
  EVar1 = (*UNRECOVERED_JUMPTABLE)(this,instId,opArray,pOVar2,pOVar3,pOVar4);
  return EVar1;
}

Assistant:

Error CodeEmitter::_emitOpArray(uint32_t instId, const Operand_* opArray, size_t opCount) {
  const Operand_* op = opArray;
  switch (opCount) {
    case 0: return _emit(instId, _none, _none, _none, _none);
    case 1: return _emit(instId, op[0], _none, _none, _none);
    case 2: return _emit(instId, op[0], op[1], _none, _none);
    case 3: return _emit(instId, op[0], op[1], op[2], _none);
    case 4: return _emit(instId, op[0], op[1], op[2], op[3]);
    case 5: return _emit(instId, op[0], op[1], op[2], op[3], op[4], _none);
    case 6: return _emit(instId, op[0], op[1], op[2], op[3], op[4], op[5]);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}